

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_sgrproj_filter(SgrprojInfo *sgrproj_info,SgrprojInfo *ref_sgrproj_info,aom_writer *wb)

{
  int iVar1;
  undefined8 in_RDX;
  aom_writer *in_RSI;
  int *in_RDI;
  sgr_params_type *params;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  aom_writer *in_stack_ffffffffffffffe0;
  uint16_t v;
  uint16_t ref;
  uint16_t k;
  uint16_t n;
  
  aom_write_literal(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  v = (uint16_t)in_RDX;
  ref = (uint16_t)((ulong)in_RDX >> 0x10);
  k = (uint16_t)((ulong)in_RDX >> 0x20);
  n = (uint16_t)((ulong)in_RDX >> 0x30);
  if (av1_sgr_params[*in_RDI].r[0] == 0) {
    aom_write_primitive_refsubexpfin(in_RSI,n,k,ref,v);
  }
  else if (av1_sgr_params[*in_RDI].r[1] == 0) {
    aom_write_primitive_refsubexpfin(in_RSI,n,k,ref,v);
  }
  else {
    aom_write_primitive_refsubexpfin(in_RSI,n,k,ref,v);
    aom_write_primitive_refsubexpfin
              (in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),(uint16_t)((ulong)in_RDX >> 0x20),
               (uint16_t)((ulong)in_RDX >> 0x10),(uint16_t)in_RDX);
  }
  iVar1 = in_RDI[1];
  in_RSI->pos = in_RDI[0];
  *(int *)&in_RSI->field_0x4 = iVar1;
  *(int *)&in_RSI->buffer = in_RDI[2];
  return;
}

Assistant:

static inline void write_sgrproj_filter(const SgrprojInfo *sgrproj_info,
                                        SgrprojInfo *ref_sgrproj_info,
                                        aom_writer *wb) {
  aom_write_literal(wb, sgrproj_info->ep, SGRPROJ_PARAMS_BITS);
  const sgr_params_type *params = &av1_sgr_params[sgrproj_info->ep];

  if (params->r[0] == 0) {
    assert(sgrproj_info->xqd[0] == 0);
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  } else if (params->r[1] == 0) {
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
  } else {
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX0 - SGRPROJ_PRJ_MIN0 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0,
        sgrproj_info->xqd[0] - SGRPROJ_PRJ_MIN0);
    aom_write_primitive_refsubexpfin(
        wb, SGRPROJ_PRJ_MAX1 - SGRPROJ_PRJ_MIN1 + 1, SGRPROJ_PRJ_SUBEXP_K,
        ref_sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1,
        sgrproj_info->xqd[1] - SGRPROJ_PRJ_MIN1);
  }

  memcpy(ref_sgrproj_info, sgrproj_info, sizeof(*sgrproj_info));
}